

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O2

bool __thiscall LinearGE<1,_1>::propagate(LinearGE<1,_1> *this)

{
  Lit *pLVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Lit LVar5;
  anon_union_8_2_743a5d44_for_Reason_0 aVar6;
  ulong uVar7;
  int *piVar8;
  long lVar9;
  BoolView *this_00;
  IntView<2> *pIVar10;
  IntView<3> *pIVar11;
  uint j;
  ulong uVar12;
  uint j_1;
  uint j_2;
  long lVar13;
  int64_t iVar14;
  
  this_00 = &this->r;
  bVar2 = BoolView::isFalse(this_00);
  if (!bVar2) {
    iVar14 = this->fix_sum;
    uVar7 = (ulong)(uint)this->fix_x;
    uVar12 = (ulong)(this->x).sz;
    piVar8 = &(this->x).data[uVar7].a;
    for (; uVar7 < uVar12; uVar7 = uVar7 + 1) {
      iVar14 = iVar14 + (long)*piVar8 * (long)(((IntView<2> *)(piVar8 + -2))->var->max).v;
      piVar8 = piVar8 + 4;
    }
    uVar7 = (ulong)(uint)this->fix_y;
    piVar8 = &(this->y).data[uVar7].a;
    for (; uVar7 < (this->y).sz; uVar7 = uVar7 + 1) {
      iVar14 = iVar14 + (long)*piVar8 * -(long)(((IntView<3> *)(piVar8 + -2))->var->min).v;
      piVar8 = piVar8 + 4;
    }
    if ((iVar14 < 0) && ((uint)(this->r).s * 2 + -1 != (int)sat.assigns.data[(uint)(this->r).v])) {
      if (so.lazy == true) {
        lVar13 = 0;
        for (uVar7 = 0; uVar7 < uVar12; uVar7 = uVar7 + 1) {
          iVar4 = (**(code **)(**(long **)((long)&((this->x).data)->var + lVar13) + 0x48))();
          (this->ps).data[uVar7 + 1].x = iVar4;
          uVar12 = (ulong)(this->x).sz;
          lVar13 = lVar13 + 0x10;
        }
        lVar13 = 0;
        for (uVar12 = 0; uVar12 < (this->y).sz; uVar12 = uVar12 + 1) {
          iVar4 = (**(code **)(**(long **)((long)&((this->y).data)->var + lVar13) + 0x40))();
          (this->ps).data[(this->x).sz + (int)uVar12 + 1].x = iVar4;
          lVar13 = lVar13 + 0x10;
        }
        aVar6._pt = Reason_new<vec<Lit>>(&this->ps);
      }
      else {
        aVar6._pt = (Clause *)0x0;
      }
      bVar2 = BoolView::setVal(this_00,false,(Reason)aVar6);
      if (!bVar2) {
        return false;
      }
    }
    bVar2 = BoolView::isTrue(this_00);
    if (bVar2) {
      for (uVar12 = (ulong)(uint)this->fix_x; uVar12 < (this->x).sz; uVar12 = uVar12 + 1) {
        pIVar10 = (this->x).data;
        lVar13 = (long)((pIVar10[uVar12].var)->max).v * (long)pIVar10[uVar12].a - iVar14;
        if ((long)((pIVar10[uVar12].var)->min).v * (long)pIVar10[uVar12].a < lVar13) {
          if (so.lazy == true) {
            if (sat.assigns.data[(uint)(this->r).v] != '\0') {
              LVar5 = BoolView::getValLit(this_00);
              ((this->ps).data)->x = LVar5.x;
            }
            lVar9 = 0;
            for (uVar7 = 0; uVar7 < (this->x).sz; uVar7 = uVar7 + 1) {
              iVar4 = (**(code **)(**(long **)((long)&((this->x).data)->var + lVar9) + 0x48))();
              (this->ps).data[uVar7 + 1].x = iVar4;
              lVar9 = lVar9 + 0x10;
            }
            lVar9 = 0;
            for (uVar7 = 0; uVar7 < (this->y).sz; uVar7 = uVar7 + 1) {
              iVar4 = (**(code **)(**(long **)((long)&((this->y).data)->var + lVar9) + 0x40))();
              (this->ps).data[(this->x).sz + (int)uVar7 + 1].x = iVar4;
              lVar9 = lVar9 + 0x10;
            }
            pLVar1 = (this->ps).data;
            pLVar1[(int)uVar12 + 1].x = pLVar1->x;
            aVar6._pt = Reason_new<vec<Lit>>(&this->ps);
            pIVar10 = (this->x).data;
          }
          else {
            aVar6._pt = (Clause *)0x0;
          }
          bVar2 = IntView<2>::setMin(pIVar10 + uVar12,lVar13,(Reason)aVar6,true);
          if (!bVar2) {
            return false;
          }
        }
      }
      for (uVar12 = (ulong)(uint)this->fix_y; bVar2 = (this->y).sz <= uVar12, !bVar2;
          uVar12 = uVar12 + 1) {
        pIVar11 = (this->y).data;
        lVar13 = -(long)((pIVar11[uVar12].var)->min).v * (long)pIVar11[uVar12].a - iVar14;
        if (-(long)((pIVar11[uVar12].var)->max).v * (long)pIVar11[uVar12].a < lVar13) {
          if (so.lazy == true) {
            if (sat.assigns.data[(uint)(this->r).v] != '\0') {
              LVar5 = BoolView::getValLit(this_00);
              ((this->ps).data)->x = LVar5.x;
            }
            lVar9 = 0;
            for (uVar7 = 0; uVar7 < (this->x).sz; uVar7 = uVar7 + 1) {
              iVar4 = (**(code **)(**(long **)((long)&((this->x).data)->var + lVar9) + 0x48))();
              (this->ps).data[uVar7 + 1].x = iVar4;
              lVar9 = lVar9 + 0x10;
            }
            lVar9 = 0;
            for (uVar7 = 0; uVar7 < (this->y).sz; uVar7 = uVar7 + 1) {
              iVar4 = (**(code **)(**(long **)((long)&((this->y).data)->var + lVar9) + 0x40))();
              (this->ps).data[(this->x).sz + (int)uVar7 + 1].x = iVar4;
              lVar9 = lVar9 + 0x10;
            }
            pLVar1 = (this->ps).data;
            pLVar1[(this->x).sz + (int)uVar12 + 1].x = pLVar1->x;
            aVar6._pt = Reason_new<vec<Lit>>(&this->ps);
            pIVar11 = (this->y).data;
          }
          else {
            aVar6._pt = (Clause *)0x0;
          }
          bVar3 = IntView<3>::setMin(pIVar11 + uVar12,lVar13,(Reason)aVar6,true);
          if (!bVar3) {
            return bVar2;
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		int64_t max_sum = fix_sum;

		for (unsigned int i = fix_x; i < x.size(); i++) {
			max_sum += x[i].getMax();
		}
		for (unsigned int i = fix_y; i < y.size(); i++) {
			max_sum += y[i].getMax();
		}

		//		if (R && max_sum < 0) setDom2(r, setVal, 0, x.size()+y.size());

		if ((R != 0) && max_sum < 0) {
			const int64_t v = 0;
			if (r.setValNotR(v != 0)) {
				Reason expl;
				if (so.lazy) {
					for (unsigned int j = 0; j < x.size(); j++) {
						ps[j + 1] = x[j].getMaxLit();
					}
					for (unsigned int j = 0; j < y.size(); j++) {
						ps[j + 1 + x.size()] = y[j].getMaxLit();
					}
					expl = Reason_new(ps);
				}
				if (!r.setVal(v != 0, expl)) {
					return false;
				}
			}
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		//		for (int i = fix_x; i < x.size(); i++) {
		//			setDom2(x[i], setMin, x[i].getMax()-max_sum, i);
		//		}

		//		for (int i = fix_y; i < y.size(); i++) {
		//			setDom2(y[i], setMin, y[i].getMax()-max_sum, x.size()+i);
		//		}

		for (unsigned int i = fix_x; i < x.size(); i++) {
			const int64_t v = x[i].getMax() - max_sum;
			if (x[i].setMinNotR(v)) {
				Reason expl;
				if (so.lazy) {
					if ((R != 0) && r.isFixed()) {
						ps[0] = r.getValLit();
					}
					for (unsigned int j = 0; j < x.size(); j++) {
						ps[j + R] = x[j].getMaxLit();
					}
					for (unsigned int j = 0; j < y.size(); j++) {
						ps[j + R + x.size()] = y[j].getMaxLit();
					}
					ps[R + i] = ps[0];
					expl = Reason_new(ps);
				}
				if (!x[i].setMin(v, expl)) {
					return false;
				}
			}
		}

		for (unsigned int i = fix_y; i < y.size(); i++) {
			const int64_t v = y[i].getMax() - max_sum;
			if (y[i].setMinNotR(v)) {
				Reason expl;
				if (so.lazy) {
					if ((R != 0) && r.isFixed()) {
						ps[0] = r.getValLit();
					}
					for (unsigned int j = 0; j < x.size(); j++) {
						ps[j + R] = x[j].getMaxLit();
					}
					for (unsigned int j = 0; j < y.size(); j++) {
						ps[j + R + x.size()] = y[j].getMaxLit();
					}
					ps[R + x.size() + i] = ps[0];
					expl = Reason_new(ps);
				}
				if (!y[i].setMin(v, expl)) {
					return false;
				}
			}
		}

		return true;
	}